

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.cpp
# Opt level: O1

int vkt::tessellation::getClampedRoundedTessLevel(SpacingMode mode,float tessLevel)

{
  uint uVar1;
  float fVar2;
  
  if (mode == SPACINGMODE_FRACTIONAL_EVEN) {
    fVar2 = 2.0;
  }
  else {
    if ((mode != SPACINGMODE_FRACTIONAL_ODD) && (fVar2 = 0.0, mode != SPACINGMODE_EQUAL))
    goto LAB_007b2d85;
    fVar2 = 1.0;
  }
  if (fVar2 <= tessLevel) {
    fVar2 = tessLevel;
  }
LAB_007b2d85:
  fVar2 = ceilf(fVar2);
  uVar1 = (uint)fVar2;
  if (mode == SPACINGMODE_FRACTIONAL_EVEN) {
    uVar1 = uVar1 + (int)uVar1 % 2;
  }
  else if (mode == SPACINGMODE_FRACTIONAL_ODD) {
    uVar1 = uVar1 - ((int)uVar1 >> 0x1f) | 1;
  }
  return uVar1;
}

Assistant:

int getClampedRoundedTessLevel (const SpacingMode mode, const float tessLevel)
{
	return getRoundedTessLevel(mode, getClampedTessLevel(mode, tessLevel));
}